

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

void __thiscall ON_ShutLining::ON_ShutLining(ON_ShutLining *this,ON_XMLNode *sl_node)

{
  ON_SimpleArray<ON_ShutLining::Curve_*> *this_00;
  bool bVar1;
  int iVar2;
  CImpl *pCVar3;
  CImplSL *pCVar4;
  undefined4 extraout_var;
  wchar_t *name;
  ON_XMLNode *pOVar5;
  undefined4 extraout_var_00;
  Curve *this_01;
  ON_XMLNode *this_02;
  ChildIterator it;
  ON_XMLNode new_sl_node;
  Curve *local_130;
  ChildIterator local_128;
  ON_XMLNode local_118;
  
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_MeshModifier_00814370
  ;
  pCVar3 = (CImpl *)operator_new(0x40);
  *(undefined8 *)
   ((long)&(pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (pCVar3->super_ON_InternalXMLImpl)._local_node = (ON_XMLNode *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._model_node = (ON_XMLNode *)0x0;
  (pCVar3->super_ON_InternalXMLImpl)._vptr_ON_InternalXMLImpl =
       (_func_int **)&PTR__ON_InternalXMLImpl_00814c98;
  (this->super_ON_MeshModifier).m_impl = pCVar3;
  (this->super_ON_MeshModifier)._vptr_ON_MeshModifier = (_func_int **)&PTR__ON_ShutLining_00814b68;
  pCVar4 = (CImplSL *)operator_new(0x18);
  (pCVar4->m_curves)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814d58;
  (pCVar4->m_curves).m_a = (Curve **)0x0;
  (pCVar4->m_curves).m_count = 0;
  (pCVar4->m_curves).m_capacity = 0;
  this->m_impl_sl = pCVar4;
  iVar2 = (*sl_node->_vptr_ON_XMLNode[3])(sl_node);
  name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)CONCAT44(extraout_var,iVar2));
  ON_XMLNode::ON_XMLNode(&local_118,name);
  (*sl_node->_vptr_ON_XMLNode[0x2c])(&local_128,sl_node);
  while( true ) {
    pOVar5 = ON_XMLNode::ChildIterator::GetNextChild(&local_128);
    if (pOVar5 == (ON_XMLNode *)0x0) break;
    iVar2 = (*pOVar5->_vptr_ON_XMLNode[3])(pOVar5);
    bVar1 = ::operator==(L"curve",(ON_wString *)CONCAT44(extraout_var_00,iVar2));
    if (bVar1) {
      this_00 = &this->m_impl_sl->m_curves;
      this_01 = (Curve *)operator_new(8);
      Curve::Curve(this_01,pOVar5);
      local_130 = this_01;
      ON_SimpleArray<ON_ShutLining::Curve_*>::Append(this_00,&local_130);
    }
    else {
      this_02 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(this_02,pOVar5);
      ON_XMLNode::AttachChildNode(&local_118,this_02);
    }
  }
  pOVar5 = ON_InternalXMLImpl::Node
                     (&((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl);
  ON_XMLNode::operator=(pOVar5,&local_118);
  ON_XMLNode::ChildIterator::~ChildIterator(&local_128);
  ON_XMLRootNode::~ON_XMLRootNode((ON_XMLRootNode *)&local_118);
  return;
}

Assistant:

ON_ShutLining::ON_ShutLining(const ON_XMLNode& sl_node)
{
  m_impl_sl = new CImplSL;

  // Iterate over the shut-lining node looking at each child node's name. If the child
  // node is a curve node, create a curve object to hold the curve XML. Otherwise add
  // a copy of the child node to a new shut-lining node.
  ON_XMLNode new_sl_node(sl_node.TagName());

  auto it = sl_node.GetChildIterator();
  while (ON_XMLNode* child_node = it.GetNextChild())
  {
    if (ON_SHUTLINING_CURVE == child_node->TagName())
    {
      m_impl_sl->m_curves.Append(new Curve(*child_node));
    }
    else
    {
      new_sl_node.AttachChildNode(new ON_XMLNode(*child_node));
    }
  }

  // Copy the new shut-lining node to our node. It only contains shut-lining XML with no curve nodes.
  m_impl->Node() = new_sl_node;
}